

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

BGZF * bgzf_read_init(hFILE *hfpr)

{
  ssize_t sVar1;
  hFILE_backend *phVar2;
  void *pvVar3;
  kh_cache_t *pkVar4;
  bool bVar5;
  bool local_44;
  bool local_41;
  ssize_t n;
  uint8_t magic [18];
  BGZF *fp;
  hFILE *hfpr_local;
  
  sVar1 = hpeek(hfpr,&n,0x12);
  if (sVar1 < 0) {
    hfpr_local = (hFILE *)0x0;
  }
  else {
    register0x00000000 = (hFILE *)calloc(1,0x60);
    if (register0x00000000 == (hFILE *)0x0) {
      hfpr_local = (hFILE *)0x0;
    }
    else {
      *(uint *)&register0x00000000->buffer = *(uint *)&register0x00000000->buffer & 0xfffcffff;
      local_41 = false;
      if ((sVar1 == 2) && (local_41 = false, (char)n == '\x1f')) {
        local_41 = n._1_1_ == -0x75;
      }
      *(uint *)&register0x00000000->buffer =
           *(uint *)&register0x00000000->buffer & 0x9fffffff | (uint)local_41 << 0x1d;
      phVar2 = (hFILE_backend *)malloc(0x10000);
      stack0xffffffffffffffe0->backend = phVar2;
      pvVar3 = malloc(0x10000);
      stack0xffffffffffffffe0->offset = (off_t)pvVar3;
      bVar5 = false;
      if ((sVar1 == 0x12) && (bVar5 = false, (char)n == '\x1f')) {
        bVar5 = n._1_1_ == -0x75;
      }
      *(uint *)&stack0xffffffffffffffe0->buffer =
           *(uint *)&stack0xffffffffffffffe0->buffer & 0x9fffffff | (uint)bVar5 << 0x1d;
      local_44 = true;
      if ((*(int *)&stack0xffffffffffffffe0->buffer << 1) >> 0x1e != 0) {
        local_44 = (n._3_1_ & 4) != 0 && magic._4_4_ == 0x24342;
      }
      *(uint *)&stack0xffffffffffffffe0->buffer =
           *(uint *)&stack0xffffffffffffffe0->buffer & 0x7fffffff | (uint)!local_44 << 0x1f;
      pkVar4 = kh_init_cache();
      *(kh_cache_t **)&stack0xffffffffffffffe0->field_0x30 = pkVar4;
      hfpr_local = stack0xffffffffffffffe0;
    }
  }
  return (BGZF *)hfpr_local;
}

Assistant:

static BGZF *bgzf_read_init(hFILE *hfpr)
{
    BGZF *fp;
    uint8_t magic[18];
    ssize_t n = hpeek(hfpr, magic, 18);
    if (n < 0) return NULL;

    fp = (BGZF*)calloc(1, sizeof(BGZF));
    if (fp == NULL) return NULL;

    fp->is_write = 0;
    fp->is_compressed = (n==2 && magic[0]==0x1f && magic[1]==0x8b);
    fp->uncompressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->compressed_block = malloc(BGZF_MAX_BLOCK_SIZE);
    fp->is_compressed = (n==18 && magic[0]==0x1f && magic[1]==0x8b) ? 1 : 0;
    fp->is_gzip = ( !fp->is_compressed || ((magic[3]&4) && memcmp(&magic[12], "BC\2\0",4)==0) ) ? 0 : 1;
#ifdef BGZF_CACHE
    fp->cache = kh_init(cache);
#endif
    return fp;
}